

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

bool __thiscall HModel::OKtoSolve(HModel *this,int level,int phase)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined4 in_EAX;
  int iVar6;
  char *__s;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  uVar1 = this->mlFg_haveBasis;
  iVar2 = this->mlFg_haveMatrixColWise;
  uVar3 = this->mlFg_haveMatrixRowWise;
  uVar4 = this->mlFg_haveFactorArrays;
  auVar8._0_4_ = -(uint)(uVar1 == 0);
  auVar8._4_4_ = -(uint)(iVar2 == 0);
  auVar8._8_4_ = -(uint)(uVar3 == 0);
  auVar8._12_4_ = -(uint)(uVar4 == 0);
  iVar6 = movmskps(in_EAX,auVar8);
  if ((iVar6 == 0) && (this->mlFg_haveEdWt != 0)) {
    bVar5 = true;
    if (this->mlFg_haveInvert == 0) goto LAB_0012b027;
  }
  else {
    if ((auVar8._0_4_ & 1) != 0) {
      printf("Not OK to solve since mlFg_haveBasis = %d\n",0);
      iVar2 = this->mlFg_haveMatrixColWise;
    }
    if (iVar2 == 0) {
      printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n",0);
    }
LAB_0012b027:
    if (this->mlFg_haveMatrixRowWise == 0) {
      printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n",0);
    }
    if (this->mlFg_haveFactorArrays == 0) {
      printf("Not OK to solve since mlFg_haveFactorArrays = %d\n",0);
    }
    if (this->mlFg_haveEdWt == 0) {
      printf("Not OK to solve since mlFg_haveEdWt = %d\n",0);
    }
    if (this->mlFg_haveInvert == 0) {
      printf("Not OK to solve since mlFg_haveInvert = %d\n",0);
    }
    std::ostream::flush();
    bVar5 = false;
  }
  if (level < 1) {
    return bVar5;
  }
  bVar5 = nonbasicFlagBasicIndex_OK(this,this->numCol,this->numRow);
  if (bVar5) {
    bVar5 = workArrays_OK(this,phase);
    if (bVar5) {
      iVar2 = this->numTot;
      if (0 < iVar2) {
        uVar7 = 0;
        do {
          if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] != 0) {
            bVar5 = oneNonbasicMoveVsWorkArrays_OK(this,(int)uVar7);
            if (!bVar5) {
              bVar5 = false;
              printf("Error in nonbasicMoveVsWorkArrays for variable %d\n",uVar7 & 0xffffffff);
              goto LAB_0012b140;
            }
            iVar2 = this->numTot;
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)iVar2);
      }
      if (level == 1) {
        return true;
      }
      printf("OKtoSolve(%1d) not implemented\n",level);
      bVar5 = true;
      goto LAB_0012b140;
    }
    __s = "Error in workArrays";
  }
  else {
    __s = "Error in nonbasicFlag and basicIndex";
  }
  puts(__s);
  bVar5 = false;
LAB_0012b140:
  std::ostream::flush();
  return bVar5;
}

Assistant:

bool HModel::OKtoSolve(int level, int phase) {
  //  printf("Called OKtoSolve(%1d, %1d)\n", level, phase);
  bool ok;
  // Level 0: Minimal check - just look at flags. This means we trust them!
  ok = mlFg_haveBasis
    && mlFg_haveMatrixColWise
    && mlFg_haveMatrixRowWise 
    && mlFg_haveFactorArrays
    && mlFg_haveEdWt
    && mlFg_haveInvert
    ;
  if (!ok) {
    if (!mlFg_haveBasis) printf("Not OK to solve since mlFg_haveBasis = %d\n", mlFg_haveBasis);
    if (!mlFg_haveMatrixColWise) printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n", mlFg_haveMatrixColWise);
    if (!mlFg_haveMatrixRowWise) printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n", mlFg_haveMatrixRowWise);
    if (!mlFg_haveFactorArrays) printf("Not OK to solve since mlFg_haveFactorArrays = %d\n", mlFg_haveFactorArrays);
    if (!mlFg_haveEdWt) printf("Not OK to solve since mlFg_haveEdWt = %d\n", mlFg_haveEdWt);
    if (!mlFg_haveInvert) printf("Not OK to solve since mlFg_haveInvert = %d\n", mlFg_haveInvert);
    cout << flush;
  }
#ifdef JAJH_dev
  assert(ok);
#endif
  if (level <= 0) return ok;
  // Level 1: Basis and data check
  ok = nonbasicFlagBasicIndex_OK(numCol, numRow);
  if (!ok) {
    printf("Error in nonbasicFlag and basicIndex\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  ok = workArrays_OK(phase);
  if (!ok) {
    printf("Error in workArrays\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  for (int var = 0; var < numTot; ++var) {
    if (nonbasicFlag[var]) {
      //Nonbasic variable
      ok = oneNonbasicMoveVsWorkArrays_OK(var);
      if (!ok) {
	printf("Error in nonbasicMoveVsWorkArrays for variable %d\n", var);cout << flush;
#ifdef JAJH_dev
	assert(ok);
#endif
	return ok;
      }
    } 
  }
  if (level <= 1) return ok;
  printf("OKtoSolve(%1d) not implemented\n", level);cout << flush;
  return ok;
}